

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seahash.c
# Opt level: O3

uint64_t seahash(char *key,int len,uint64_t seed)

{
  undefined1 (*pauVar1) [16];
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint8_t pad [8];
  ulong local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  auVar12._8_8_ = 0xb480a793d8e6c86c;
  auVar12._0_8_ = 0xb480a793d8e6c86c;
  local_60 = 0;
  local_38 = vpinsrq_avx(auVar12,seed ^ 0x16f11fe89b0d677c,0);
  uVar5 = len;
  local_48 = _DAT_001a4b10;
  if (0x1f < len) {
    auVar7._8_8_ = 0x6eed0e9da4d94a4f;
    auVar7._0_8_ = 0x6eed0e9da4d94a4f;
    uVar4 = len;
    do {
      auVar12 = *(undefined1 (*) [16])key;
      pauVar1 = (undefined1 (*) [16])((long)key + 0x10);
      key = (char *)((long)key + 0x20);
      uVar5 = uVar4 - 0x20;
      auVar6 = vpmullq_avx512vl(local_38 ^ auVar12,auVar7);
      auVar12 = vpsrlq_avx(auVar6,0x20);
      auVar13 = vpsrlq_avx(auVar6,0x3c);
      auVar12 = vpsrlvq_avx2(auVar12,auVar13);
      local_38 = vpmullq_avx512vl(auVar12 ^ auVar6,auVar7);
      auVar6 = vpmullq_avx512vl(local_48 ^ *pauVar1,auVar7);
      auVar12 = vpsrlq_avx(auVar6,0x20);
      auVar13 = vpsrlq_avx(auVar6,0x3c);
      auVar12 = vpsrlvq_avx2(auVar12,auVar13);
      local_48 = vpmullq_avx512vl(auVar12 ^ auVar6,auVar7);
      bVar2 = 0x3f < uVar4;
      uVar4 = uVar5;
    } while (bVar2);
  }
  uVar3 = local_48._0_8_;
  local_58 = local_38;
  switch(uVar5) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    memcpy(&local_60,key,(ulong)uVar5);
    uVar3 = (local_58._0_8_ ^ local_60) * 0x6eed0e9da4d94a4f;
    local_38 = vpinsrq_avx(local_58,((uVar3 >> 0x20) >> (uVar3 >> 0x3c) ^ uVar3) *
                                    0x6eed0e9da4d94a4f,0);
    break;
  case 8:
    uVar3 = (local_38._0_8_ ^ *(ulong *)*(undefined1 (*) [16])key) * 0x6eed0e9da4d94a4f;
    local_38 = vpinsrq_avx(local_38,((uVar3 >> 0x20) >> (uVar3 >> 0x3c) ^ uVar3) *
                                    0x6eed0e9da4d94a4f,0);
    break;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    local_38._8_8_ = 0;
    local_38._0_8_ = *(ulong *)*(undefined1 (*) [16])key;
    memcpy(&local_60,*(undefined1 (*) [16])key + 8,(ulong)(uVar5 - 8));
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_60;
    local_38 = vpunpcklqdq_avx(local_38,auVar9);
    local_38 = local_38 ^ local_58;
    goto LAB_00174edb;
  case 0x10:
    local_38 = local_38 ^ *(undefined1 (*) [16])key;
LAB_00174edb:
    auVar10._8_8_ = 0x6eed0e9da4d94a4f;
    auVar10._0_8_ = 0x6eed0e9da4d94a4f;
    auVar7 = vpmullq_avx512vl(local_38,auVar10);
    auVar12 = vpsrlq_avx(auVar7,0x20);
    auVar6 = vpsrlq_avx(auVar7,0x3c);
    auVar12 = vpsrlvq_avx2(auVar12,auVar6);
    local_38 = vpmullq_avx512vl(auVar12 ^ auVar7,auVar10);
    break;
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
    local_58 = local_38 ^ *(undefined1 (*) [16])key;
    memcpy(&local_60,(undefined1 (*) [16])((long)key + 0x10),(ulong)(uVar5 - 0x10));
    auVar8._8_8_ = 0x6eed0e9da4d94a4f;
    auVar8._0_8_ = 0x6eed0e9da4d94a4f;
    auVar7 = vpmullq_avx512vl(auVar8,local_58);
    uVar3 = (uVar3 ^ local_60) * 0x6eed0e9da4d94a4f;
    uVar3 = (uVar3 >> 0x20) >> (uVar3 >> 0x3c) ^ uVar3;
    auVar12 = vpsrlq_avx(auVar7,0x20);
    auVar6 = vpsrlq_avx(auVar7,0x3c);
    auVar12 = vpsrlvq_avx2(auVar12,auVar6);
    local_38 = vpmullq_avx512vl(auVar12 ^ auVar7,auVar8);
    goto LAB_00174e8a;
  case 0x18:
    auVar11._8_8_ = 0x6eed0e9da4d94a4f;
    auVar11._0_8_ = 0x6eed0e9da4d94a4f;
    uVar3 = (uVar3 ^ *(ulong *)*(undefined1 (*) [16])((long)key + 0x10)) * 0x6eed0e9da4d94a4f;
    auVar7 = vpmullq_avx512vl(local_38 ^ *(undefined1 (*) [16])key,auVar11);
    uVar3 = (uVar3 >> 0x20) >> (uVar3 >> 0x3c) ^ uVar3;
    auVar12 = vpsrlq_avx(auVar7,0x20);
    auVar6 = vpsrlq_avx(auVar7,0x3c);
    auVar12 = vpsrlvq_avx2(auVar12,auVar6);
    local_38 = vpmullq_avx512vl(auVar12 ^ auVar7,auVar11);
LAB_00174e8a:
    local_48 = vpinsrq_avx(local_48,uVar3 * 0x6eed0e9da4d94a4f,0);
    break;
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
    local_38 = local_38 ^ *(undefined1 (*) [16])key;
    local_58._8_8_ = 0;
    local_58._0_8_ = *(ulong *)*(undefined1 (*) [16])((long)key + 0x10);
    memcpy(&local_60,*(undefined1 (*) [16])((long)key + 0x10) + 8,(ulong)(uVar5 - 0x18));
    auVar6._8_8_ = 0x6eed0e9da4d94a4f;
    auVar6._0_8_ = 0x6eed0e9da4d94a4f;
    auVar7 = vpmullq_avx512vl(auVar6,local_38);
    auVar12 = vpsrlq_avx(auVar7,0x20);
    auVar13 = vpsrlq_avx(auVar7,0x3c);
    auVar12 = vpsrlvq_avx2(auVar12,auVar13);
    local_38 = vpmullq_avx512vl(auVar12 ^ auVar7,auVar6);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_60;
    auVar12 = vpunpcklqdq_avx(local_58,auVar13);
    auVar7 = vpmullq_avx512vl(auVar12 ^ local_48,auVar6);
    auVar12 = vpsrlq_avx(auVar7,0x20);
    auVar13 = vpsrlq_avx(auVar7,0x3c);
    auVar12 = vpsrlvq_avx2(auVar12,auVar13);
    local_48 = vpmullq_avx512vl(auVar12 ^ auVar7,auVar6);
  }
  auVar12 = vpshufd_avx(local_38,0x4e);
  auVar7 = vpshufd_avx(auVar12 ^ local_48,0xee);
  uVar3 = (SUB168(auVar12 ^ local_48,0) ^ auVar7._0_8_ ^ (long)len) * 0x6eed0e9da4d94a4f;
  uVar3 = ((uVar3 >> 0x20) >> (uVar3 >> 0x3c) ^ uVar3) * 0x6eed0e9da4d94a4f;
  return uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
}

Assistant:

uint64_t seahash(const char *key, int len, uint64_t seed) {
  uint64_t a, b, c, d;
  uint64_t s = seed;
  uint64_t *p;
  uint8_t pad[8] = {0};
  const uint64_t orig_len = (uint64_t)len;

  a = 0x16f11fe89b0d677cULL ^ s;
  b = 0xb480a793d8e6c86cULL;
  c = 0x6fe2e5aaf078ebc9ULL;
  d = 0x14f994a4c5259381ULL;

  p = (uint64_t *)key;
  while (len >= 32) {
    a ^= *p++;
    b ^= *p++;
    c ^= *p++;
    d ^= *p++;
    a = diffuse(a);
    b = diffuse(b);
    c = diffuse(c);
    d = diffuse(d);
    len -= 32;
  }

  switch (len) {
    // illegal msvc 15 syntax
    case 25 ... 31:
      a ^= *p++;
      b ^= *p++;
      c ^= *p++;
      memcpy(pad, p, len - 24);
      d ^= *(uint64_t *)pad;
      a = diffuse(a);
      b = diffuse(b);
      c = diffuse(c);
      d = diffuse(d);
      break;
    case 24:
      a ^= *p++;
      b ^= *p++;
      c ^= *p++;
      a = diffuse(a);
      b = diffuse(b);
      c = diffuse(c);
      break;
    case 17 ... 23:
      a ^= *p++;
      b ^= *p++;
      memcpy(pad, p, len - 16);
      c ^= *(uint64_t *)pad;
      a = diffuse(a);
      b = diffuse(b);
      c = diffuse(c);
      break;
    case 16:
      a ^= *p++;
      b ^= *p++;
      a = diffuse(a);
      b = diffuse(b);
      break;
    case 9 ... 15:
      a ^= *p++;
      memcpy(pad, p, len - 8);
      b ^= *(uint64_t *)pad;
      a = diffuse(a);
      b = diffuse(b);
      break;
    case 8:
      a ^= *p++;
      a = diffuse(a);
      break;
    case 1 ... 7:
      memcpy(pad, p, len);
      a ^= *(uint64_t *)pad;
      a = diffuse(a);
      break;
    case 0:
      break;
    default:
      assert(0);
  }

  a ^= b;
  c ^= d;
  a ^= c;
  a ^= orig_len;
  return sea_swap64(diffuse(a));
}